

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::ClientContext::PendingQueryInternal
          (ClientContext *this,ClientContextLock *lock,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,PendingQueryParameters *parameters,bool verify)

{
  element_type *peVar1;
  pointer pSVar2;
  int in_R9D;
  shared_ptr<duckdb::PreparedStatementData,_true> prepared;
  string query;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> local_50 [4];
  
  pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                       *)parameters);
  ::std::__cxx11::string::string((string *)local_50,(string *)&pSVar2->query);
  local_68 = (undefined1  [8])0x0;
  a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (element_type *)(parameters->parameters).ptr;
  if (in_R9D == 0) {
    (parameters->parameters).ptr =
         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
          *)0x0;
    local_78._8_8_ = peVar1;
    PendingStatementOrPreparedStatement
              (this,lock,(string *)statement,local_50,
               (shared_ptr<duckdb::PreparedStatementData,_true> *)(local_78 + 8),
               (PendingQueryParameters *)local_68);
    if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
      (*(code *)((_Hashtable *)local_78._8_8_)->_M_buckets[1])();
    }
  }
  else {
    (parameters->parameters).ptr =
         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
          *)0x0;
    local_78._0_8_ = peVar1;
    PendingStatementOrPreparedStatementInternal
              (this,lock,(string *)statement,local_50,
               (shared_ptr<duckdb::PreparedStatementData,_true> *)local_78,
               (PendingQueryParameters *)local_68);
    if ((element_type *)local_78._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_78._0_8_ + 8))();
    }
    local_78._0_8_ = (element_type *)0x0;
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
  ::std::__cxx11::string::~string((string *)local_50);
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> ClientContext::PendingQueryInternal(ClientContextLock &lock,
                                                                   unique_ptr<SQLStatement> statement,
                                                                   const PendingQueryParameters &parameters,
                                                                   bool verify) {
	auto query = statement->query;
	shared_ptr<PreparedStatementData> prepared;
	if (verify) {
		return PendingStatementOrPreparedStatementInternal(lock, query, std::move(statement), prepared, parameters);
	} else {
		return PendingStatementOrPreparedStatement(lock, query, std::move(statement), prepared, parameters);
	}
}